

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

FilePathList LoadDirectoryFilesEx(char *basePath,char *filter,_Bool scanSubdirs)

{
  FilePathList FVar1;
  char **ppcVar2;
  char *pcVar3;
  uint i;
  long lVar4;
  FilePathList local_40;
  
  local_40.count = 0;
  local_40.capacity = 0x2000;
  ppcVar2 = (char **)calloc(0x2000,8);
  local_40.paths = ppcVar2;
  for (lVar4 = 0; lVar4 != 0x2000; lVar4 = lVar4 + 1) {
    pcVar3 = (char *)calloc(0x1000,1);
    ppcVar2[lVar4] = pcVar3;
  }
  if (scanSubdirs) {
    ScanDirectoryFilesRecursively(basePath,&local_40,filter);
  }
  else {
    ScanDirectoryFiles(basePath,&local_40,filter);
  }
  FVar1.count = local_40.count;
  FVar1.capacity = local_40.capacity;
  FVar1.paths = local_40.paths;
  return FVar1;
}

Assistant:

FilePathList LoadDirectoryFilesEx(const char *basePath, const char *filter, bool scanSubdirs)
{
    FilePathList files = { 0 };

    files.capacity = MAX_FILEPATH_CAPACITY;
    files.paths = (char **)RL_CALLOC(files.capacity, sizeof(char *));
    for (unsigned int i = 0; i < files.capacity; i++) files.paths[i] = (char *)RL_CALLOC(MAX_FILEPATH_LENGTH, sizeof(char));

    // WARNING: basePath is always prepended to scanned paths
    if (scanSubdirs) ScanDirectoryFilesRecursively(basePath, &files, filter);
    else ScanDirectoryFiles(basePath, &files, filter);

    return files;
}